

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

uint32_t absl::lts_20240722::hash_internal::MixingHashState::Read1To3(uchar *p,size_t len)

{
  return (uint)p[len - 1] << (((char)len + -1) * '\b' & 0x1fU) | (uint)*p |
         (uint)p[len >> 1] << ((byte)((int)(len >> 1) << 3) & 0x1f);
}

Assistant:

static uint32_t Read1To3(const unsigned char* p, size_t len) {
    // The trick used by this implementation is to avoid branches if possible.
    unsigned char mem0 = p[0];
    unsigned char mem1 = p[len / 2];
    unsigned char mem2 = p[len - 1];
#ifdef ABSL_IS_LITTLE_ENDIAN
    unsigned char significant2 = mem2;
    unsigned char significant1 = mem1;
    unsigned char significant0 = mem0;
#else
    unsigned char significant2 = mem0;
    unsigned char significant1 = len == 2 ? mem0 : mem1;
    unsigned char significant0 = mem2;
#endif
    return static_cast<uint32_t>(significant0 |                     //
                                 (significant1 << (len / 2 * 8)) |  //
                                 (significant2 << ((len - 1) * 8)));
  }